

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindInstancesProcess.cpp
# Opt level: O0

void UpdateMeshIndices(aiNode *node,uint *lookup)

{
  uint local_20;
  uint local_1c;
  uint n_1;
  uint n;
  uint *lookup_local;
  aiNode *node_local;
  
  for (local_1c = 0; local_1c < node->mNumMeshes; local_1c = local_1c + 1) {
    node->mMeshes[local_1c] = lookup[node->mMeshes[local_1c]];
  }
  for (local_20 = 0; local_20 < node->mNumChildren; local_20 = local_20 + 1) {
    UpdateMeshIndices(node->mChildren[local_20],lookup);
  }
  return;
}

Assistant:

void UpdateMeshIndices(aiNode* node, unsigned int* lookup)
{
    for (unsigned int n = 0; n < node->mNumMeshes;++n)
        node->mMeshes[n] = lookup[node->mMeshes[n]];

    for (unsigned int n = 0; n < node->mNumChildren;++n)
        UpdateMeshIndices(node->mChildren[n],lookup);
}